

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v11::detail::dragonbox::to_decimal<float>(float x)

{
  uint32_t uVar1;
  bool bVar2;
  compute_mul_parity_result cVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  compute_mul_result cVar7;
  decimal_fp<float> dVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  significand_type sVar13;
  uint uVar14;
  decimal_fp<float> local_50;
  ulong local_48;
  cache_entry_type cache;
  uint32_t dist;
  
  uVar10 = (uint)x & 0x7fffff;
  uVar11 = (uint)x >> 0x17 & 0xff;
  if (uVar11 == 0) {
    iVar12 = -0x95;
    if (uVar10 == 0) {
      dVar8.significand = 0;
      dVar8.exponent = 0;
      return dVar8;
    }
  }
  else {
    iVar12 = uVar11 - 0x96;
    if (uVar10 == 0) {
      dVar8 = shorter_interval_case<float>(iVar12);
      return dVar8;
    }
    uVar10 = uVar10 | 0x800000;
  }
  iVar4 = floor_log10_pow2(iVar12);
  uVar6 = cache_accessor<float>::get_cached_power(1 - iVar4);
  cache = uVar6;
  iVar5 = floor_log2_pow10(1 - iVar4);
  iVar5 = iVar5 + iVar12;
  local_48 = (ulong)(uVar10 * 2);
  cVar7 = cache_accessor<float>::compute_mul(uVar10 * 2 + 1 << ((byte)iVar5 & 0x1f),&cache);
  uVar9 = (ulong)cVar7 & 0xffffffff;
  iVar12 = (int)(uVar9 / 100);
  local_50.significand = (significand_type)(uVar9 / 100);
  uVar11 = local_50.significand * -100 + cVar7.result;
  uVar14 = (uint)(uVar6 >> (~(byte)iVar5 & 0x3f));
  if (uVar11 < uVar14) {
    if ((uVar11 != 0) || ((uVar10 & 1 & cVar7._4_4_) == 0)) {
LAB_001b2333:
      local_50.exponent = iVar4 + 1;
      iVar12 = remove_trailing_zeros(&local_50.significand,0);
      local_50.exponent = local_50.exponent + iVar12;
      return local_50;
    }
    iVar12 = (int)(uVar9 / 100) + -1;
    uVar11 = 100;
  }
  else if ((uVar11 <= uVar14) &&
          (cVar3 = cache_accessor<float>::compute_mul_parity((int)local_48 - 1,&cache,iVar5),
          (~uVar10 & (uint)((ushort)cVar3 >> 8) & 1) != 0 || ((ushort)cVar3 & 1) != 0))
  goto LAB_001b2333;
  uVar11 = uVar11 - (uVar14 >> 1);
  dist = uVar11 + 5;
  local_50.exponent = iVar4;
  bVar2 = check_divisibility_and_divide_by_pow10<1>(&dist);
  uVar1 = dist;
  sVar13 = iVar12 * 10 + dist;
  local_50.significand = sVar13;
  if ((bVar2) &&
     ((cVar3 = cache_accessor<float>::compute_mul_parity((carrier_uint)local_48,&cache,iVar5),
      (uVar11 & 1) != ((ushort)cVar3 & 1) || (((ushort)cVar3 >> 8 & uVar1 & 1) != 0)))) {
    local_50.significand = sVar13 - 1;
  }
  return local_50;
}

Assistant:

auto small_division_by_pow10(uint32_t n) noexcept -> uint32_t {
  constexpr auto info = div_small_pow10_infos[N - 1];
  FMT_ASSERT(n <= info.divisor * 10, "n is too large");
  constexpr uint32_t magic_number =
      (1u << info.shift_amount) / info.divisor + 1;
  return (n * magic_number) >> info.shift_amount;
}